

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_check_dtls_clihlo_cookie
              (undefined1 *f_cookie_write,undefined1 *f_cookie_check,void *p_cookie,uchar *cli_id,
              size_t cli_id_len,uchar *in,size_t in_len,uchar *obuf,size_t buf_len,size_t *olen)

{
  uchar uVar1;
  int iVar2;
  uchar *local_58;
  uchar *p;
  size_t cookie_len;
  size_t sid_len;
  uchar *in_local;
  size_t cli_id_len_local;
  uchar *cli_id_local;
  void *p_cookie_local;
  undefined1 *f_cookie_check_local;
  undefined1 *f_cookie_write_local;
  
  if ((f_cookie_write == (undefined1 *)0x0) || (f_cookie_check == (undefined1 *)0x0)) {
    f_cookie_write_local._4_4_ = -0x7100;
  }
  else if (((in_len < 0x3d) || (((*in != '\x16' || (in[3] != '\0')) || (in[4] != '\0')))) ||
          (((in[0x13] != '\0' || (in[0x14] != '\0')) || (in[0x15] != '\0')))) {
    f_cookie_write_local._4_4_ = -0x7900;
  }
  else {
    cookie_len = (size_t)in[0x3b];
    if (in_len - 0x3d < cookie_len) {
      f_cookie_write_local._4_4_ = -0x7900;
    }
    else {
      p = (uchar *)(ulong)in[cookie_len + 0x3c];
      if ((uchar *)(in_len - 0x3c) < p) {
        f_cookie_write_local._4_4_ = -0x7900;
      }
      else {
        sid_len = (size_t)in;
        in_local = (uchar *)cli_id_len;
        cli_id_len_local = (size_t)cli_id;
        cli_id_local = (uchar *)p_cookie;
        p_cookie_local = f_cookie_check;
        f_cookie_check_local = f_cookie_write;
        iVar2 = (*(code *)f_cookie_check)(p_cookie,in + cookie_len + 0x3d,p,cli_id,cli_id_len);
        if (iVar2 == 0) {
          f_cookie_write_local._4_4_ = 0;
        }
        else if (buf_len < 0x1c) {
          f_cookie_write_local._4_4_ = -0x6a00;
        }
        else {
          *(undefined8 *)obuf = *(undefined8 *)sid_len;
          *(undefined8 *)(obuf + 8) = *(undefined8 *)(sid_len + 8);
          *(undefined8 *)(obuf + 0x10) = *(undefined8 *)(sid_len + 0x10);
          obuf[0x18] = *(uchar *)(sid_len + 0x18);
          obuf[0xd] = '\x03';
          obuf[0x19] = 0xfe;
          obuf[0x1a] = 0xff;
          local_58 = obuf + 0x1c;
          iVar2 = (*(code *)f_cookie_check_local)
                            (cli_id_local,&local_58,obuf + buf_len,cli_id_len_local,in_local);
          if (iVar2 == 0) {
            *olen = (long)local_58 - (long)obuf;
            obuf[0x1b] = (char)*olen + 0xe4;
            uVar1 = (uchar)(*olen - 0x19 >> 0x10);
            obuf[0x16] = uVar1;
            obuf[0xe] = uVar1;
            uVar1 = (uchar)(*olen - 0x19 >> 8);
            obuf[0x17] = uVar1;
            obuf[0xf] = uVar1;
            uVar1 = (char)*olen + 0xe7;
            obuf[0x18] = uVar1;
            obuf[0x10] = uVar1;
            obuf[0xb] = (uchar)(*olen - 0xd >> 8);
            obuf[0xc] = (char)*olen + 0xf3;
            f_cookie_write_local._4_4_ = -0x6a80;
          }
          else {
            f_cookie_write_local._4_4_ = -0x6c00;
          }
        }
      }
    }
  }
  return f_cookie_write_local._4_4_;
}

Assistant:

static int ssl_check_dtls_clihlo_cookie(
                           mbedtls_ssl_cookie_write_t *f_cookie_write,
                           mbedtls_ssl_cookie_check_t *f_cookie_check,
                           void *p_cookie,
                           const unsigned char *cli_id, size_t cli_id_len,
                           const unsigned char *in, size_t in_len,
                           unsigned char *obuf, size_t buf_len, size_t *olen )
{
    size_t sid_len, cookie_len;
    unsigned char *p;

    if( f_cookie_write == NULL || f_cookie_check == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /*
     * Structure of ClientHello with record and handshake headers,
     * and expected values. We don't need to check a lot, more checks will be
     * done when actually parsing the ClientHello - skipping those checks
     * avoids code duplication and does not make cookie forging any easier.
     *
     *  0-0  ContentType type;                  copied, must be handshake
     *  1-2  ProtocolVersion version;           copied
     *  3-4  uint16 epoch;                      copied, must be 0
     *  5-10 uint48 sequence_number;            copied
     * 11-12 uint16 length;                     (ignored)
     *
     * 13-13 HandshakeType msg_type;            (ignored)
     * 14-16 uint24 length;                     (ignored)
     * 17-18 uint16 message_seq;                copied
     * 19-21 uint24 fragment_offset;            copied, must be 0
     * 22-24 uint24 fragment_length;            (ignored)
     *
     * 25-26 ProtocolVersion client_version;    (ignored)
     * 27-58 Random random;                     (ignored)
     * 59-xx SessionID session_id;              1 byte len + sid_len content
     * 60+   opaque cookie<0..2^8-1>;           1 byte len + content
     *       ...
     *
     * Minimum length is 61 bytes.
     */
    if( in_len < 61 ||
        in[0] != MBEDTLS_SSL_MSG_HANDSHAKE ||
        in[3] != 0 || in[4] != 0 ||
        in[19] != 0 || in[20] != 0 || in[21] != 0 )
    {
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    sid_len = in[59];
    if( sid_len > in_len - 61 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    cookie_len = in[60 + sid_len];
    if( cookie_len > in_len - 60 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    if( f_cookie_check( p_cookie, in + sid_len + 61, cookie_len,
                        cli_id, cli_id_len ) == 0 )
    {
        /* Valid cookie */
        return( 0 );
    }

    /*
     * If we get here, we've got an invalid cookie, let's prepare HVR.
     *
     *  0-0  ContentType type;                  copied
     *  1-2  ProtocolVersion version;           copied
     *  3-4  uint16 epoch;                      copied
     *  5-10 uint48 sequence_number;            copied
     * 11-12 uint16 length;                     olen - 13
     *
     * 13-13 HandshakeType msg_type;            hello_verify_request
     * 14-16 uint24 length;                     olen - 25
     * 17-18 uint16 message_seq;                copied
     * 19-21 uint24 fragment_offset;            copied
     * 22-24 uint24 fragment_length;            olen - 25
     *
     * 25-26 ProtocolVersion server_version;    0xfe 0xff
     * 27-27 opaque cookie<0..2^8-1>;           cookie_len = olen - 27, cookie
     *
     * Minimum length is 28.
     */
    if( buf_len < 28 )
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );

    /* Copy most fields and adapt others */
    memcpy( obuf, in, 25 );
    obuf[13] = MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST;
    obuf[25] = 0xfe;
    obuf[26] = 0xff;

    /* Generate and write actual cookie */
    p = obuf + 28;
    if( f_cookie_write( p_cookie,
                        &p, obuf + buf_len, cli_id, cli_id_len ) != 0 )
    {
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    *olen = p - obuf;

    /* Go back and fill length fields */
    obuf[27] = (unsigned char)( *olen - 28 );

    obuf[14] = obuf[22] = (unsigned char)( ( *olen - 25 ) >> 16 );
    obuf[15] = obuf[23] = (unsigned char)( ( *olen - 25 ) >>  8 );
    obuf[16] = obuf[24] = (unsigned char)( ( *olen - 25 )       );

    obuf[11] = (unsigned char)( ( *olen - 13 ) >>  8 );
    obuf[12] = (unsigned char)( ( *olen - 13 )       );

    return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
}